

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_br_fillup(lzx_stream *strm,lzx_br *br)

{
  undefined1 *puVar1;
  ulong uVar2;
  uint16_t uVar3;
  int iVar4;
  ulong *in_RSI;
  long *in_RDI;
  wchar_t n;
  int local_1c;
  
  local_1c = 0x40 - (int)in_RSI[1];
  do {
    iVar4 = local_1c >> 4;
    if (iVar4 == 0) {
      return L'\x01';
    }
    if (iVar4 == 3) {
      if (5 < in_RDI[1]) {
        *in_RSI = *in_RSI << 0x30 | (ulong)*(byte *)(*in_RDI + 1) << 0x28 |
                  (ulong)*(byte *)*in_RDI << 0x20 | (ulong)*(byte *)(*in_RDI + 3) << 0x18 |
                  (ulong)*(byte *)(*in_RDI + 2) << 0x10 | (ulong)*(byte *)(*in_RDI + 5) << 8 |
                  (ulong)*(byte *)(*in_RDI + 4);
        *in_RDI = *in_RDI + 6;
        in_RDI[1] = in_RDI[1] + -6;
        *(int *)(in_RSI + 1) = (int)in_RSI[1] + 0x30;
        return L'\x01';
      }
    }
    else if ((iVar4 == 4) && (7 < in_RDI[1])) {
      *in_RSI = (ulong)*(byte *)(*in_RDI + 1) << 0x38 | (ulong)*(byte *)*in_RDI << 0x30 |
                (ulong)*(byte *)(*in_RDI + 3) << 0x28 | (ulong)*(byte *)(*in_RDI + 2) << 0x20 |
                (ulong)*(byte *)(*in_RDI + 5) << 0x18 | (ulong)*(byte *)(*in_RDI + 4) << 0x10 |
                (ulong)*(byte *)(*in_RDI + 7) << 8 | (ulong)*(byte *)(*in_RDI + 6);
      *in_RDI = *in_RDI + 8;
      in_RDI[1] = in_RDI[1] + -8;
      *(int *)(in_RSI + 1) = (int)in_RSI[1] + 0x40;
      return L'\x01';
    }
    if (in_RDI[1] < 2) {
      if (in_RDI[1] == 1) {
        puVar1 = (undefined1 *)*in_RDI;
        *in_RDI = (long)(puVar1 + 1);
        *(undefined1 *)((long)in_RSI + 0xc) = *puVar1;
        in_RDI[1] = in_RDI[1] + -1;
        *(undefined1 *)((long)in_RSI + 0xd) = 1;
      }
      return L'\0';
    }
    uVar2 = *in_RSI;
    uVar3 = archive_le16dec((void *)*in_RDI);
    *in_RSI = uVar2 << 0x10 | (ulong)uVar3;
    *in_RDI = *in_RDI + 2;
    in_RDI[1] = in_RDI[1] + -2;
    *(int *)(in_RSI + 1) = (int)in_RSI[1] + 0x10;
    local_1c = local_1c + -0x10;
  } while( true );
}

Assistant:

static int
lzx_br_fillup(struct lzx_stream *strm, struct lzx_br *br)
{
/*
 * x86 proccessor family can read misaligned data without an access error.
 */
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		switch (n >> 4) {
		case 4:
			if (strm->avail_in >= 8) {
				br->cache_buffer =
				    ((uint64_t)strm->next_in[1]) << 56 |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[3]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint32_t)strm->next_in[5]) << 24 |
				    ((uint32_t)strm->next_in[4]) << 16 |
				    ((uint32_t)strm->next_in[7]) << 8 |
				     (uint32_t)strm->next_in[6];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			}
			break;
		case 3:
			if (strm->avail_in >= 6) {
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[0]) << 32 |
				    ((uint32_t)strm->next_in[3]) << 24 |
				    ((uint32_t)strm->next_in[2]) << 16 |
				    ((uint32_t)strm->next_in[5]) << 8 |
				     (uint32_t)strm->next_in[4];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			}
			break;
		case 0:
			/* We have enough compressed data in
			 * the cache buffer.*/
			return (1);
		default:
			break;
		}
		if (strm->avail_in < 2) {
			/* There is not enough compressed data to
			 * fill up the cache buffer. */
			if (strm->avail_in == 1) {
				br->odd = *strm->next_in++;
				strm->avail_in--;
				br->have_odd = 1;
			}
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 16) |
		    archive_le16dec(strm->next_in);
		strm->next_in += 2;
		strm->avail_in -= 2;
		br->cache_avail += 16;
		n -= 16;
	}
}